

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void md5_32(void *key,int len,uint32_t seed,void *out)

{
  uint hash [4];
  undefined4 local_28 [6];
  
  md5((uchar *)key,len,(uchar *)local_28,seed);
  *(undefined4 *)out = local_28[0];
  return;
}

Assistant:

void md5_32            ( const void * key, int len, uint32_t seed, void * out )
{
  unsigned int hash[4];

  md5((unsigned char*)key,len,(unsigned char*)hash, seed);

  *(uint32_t*)out = hash[0];
}